

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

string * __thiscall
iutest::StreamableToString<char_const*>(string *__return_storage_ptr__,iutest *this,char **value)

{
  iuStreamMessage local_1a0;
  
  iu_global_format_stringstream::iu_global_format_stringstream(&local_1a0.m_stream);
  detail::iuStreamMessage::operator<<(&local_1a0,(char **)this);
  std::__cxx11::stringbuf::str();
  iu_global_format_stringstream::~iu_global_format_stringstream(&local_1a0.m_stream);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string StreamableToString(const T& value)
{
    return (Message() << value).GetString();
}